

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::StmtBlock::set_parent(StmtBlock *this,IRNode *parent)

{
  pointer psVar1;
  element_type *peVar2;
  shared_ptr<kratos::Stmt> *stmt;
  pointer psVar3;
  
  (this->super_Stmt).parent_ = parent;
  psVar1 = (this->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    peVar2 = (psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar2->super_IRNode)._vptr_IRNode[7])(peVar2,this);
  }
  return;
}

Assistant:

void StmtBlock::set_parent(IRNode *parent) {
    Stmt::set_parent(parent);
    for (auto &stmt : stmts_) {
        stmt->set_parent(this);
    }
}